

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

double macheps(void)

{
  double dVar1;
  
  dVar1 = 1.0;
  do {
    dVar1 = dVar1 * 0.5;
  } while (1.0 < dVar1 + 1.0);
  return dVar1 + dVar1;
}

Assistant:

double macheps() {
	double macheps;
	macheps = 1.0;

	while ((macheps + 1.0) > 1.0) {
		macheps = macheps / 2.0;
	}

	macheps = macheps * 2;

	return macheps;
}